

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O0

char * getrumor(int truth,char *rumor_buf,boolean exclude_cookie)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  dlb *fp;
  char *pcVar4;
  long lVar5;
  bool bVar6;
  int local_24c;
  int adjtruth;
  int count;
  char xbuf [256];
  char line [256];
  char *endp;
  int beginning;
  int tidbit;
  dlb *rumors;
  boolean exclude_cookie_local;
  char *rumor_buf_local;
  int truth_local;
  
  *rumor_buf = '\0';
  if (-1 < true_rumor_size) {
    fp = dlb_fopen("rumors","r");
    if (fp == (dlb *)0x0) {
      pline("Can\'t open rumors file!");
      true_rumor_size = -1;
    }
    else {
      local_24c = 0;
      do {
        *rumor_buf = '\0';
        if ((true_rumor_size == 0) && (init_rumors(fp), true_rumor_size < 0)) {
          sprintf(rumor_buf,"Error reading \"%.80s\".","rumors");
          return rumor_buf;
        }
        iVar1 = rn2(2);
        iVar2 = truth + iVar1;
        if ((uint)(truth + 1 + iVar1) < 2) {
          endp._0_4_ = false_rumor_start;
          uVar3 = mt_random();
          endp._4_4_ = uVar3 % (uint)false_rumor_size;
        }
        else {
          if (iVar2 != 1 && iVar2 != 2) {
            warning("strange truth value for rumor");
            pcVar4 = strcpy(rumor_buf,"Oops...");
            return pcVar4;
          }
          endp._0_4_ = true_rumor_start;
          uVar3 = mt_random();
          endp._4_4_ = uVar3 % (uint)true_rumor_size;
        }
        dlb_fseek(fp,(long)(int)((int)endp + endp._4_4_),0);
        dlb_fgets(xbuf + 0xf8,0x100,fp);
        pcVar4 = dlb_fgets(xbuf + 0xf8,0x100,fp);
        if ((pcVar4 == (char *)0x0) ||
           ((0 < iVar2 && (lVar5 = dlb_ftell(fp), true_rumor_end < lVar5)))) {
          dlb_fseek(fp,(long)(int)endp,0);
          dlb_fgets(xbuf + 0xf8,0x100,fp);
        }
        pcVar4 = strchr(xbuf + 0xf8,10);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
        }
        pcVar4 = xcrypt(xbuf + 0xf8,(char *)&adjtruth);
        strcat(rumor_buf,pcVar4);
        iVar1 = local_24c + 1;
        bVar6 = false;
        if ((local_24c < 0x32) && (bVar6 = false, exclude_cookie != '\0')) {
          pcVar4 = strstri(rumor_buf,"fortune");
          bVar6 = true;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = strstri(rumor_buf,"pity");
            bVar6 = pcVar4 != (char *)0x0;
          }
        }
        local_24c = iVar1;
      } while (bVar6);
      dlb_fclose(fp);
      if (iVar1 < 0x32) {
        exercise(2,0 < iVar2);
      }
      else {
        warning("Can\'t find non-cookie rumor?");
      }
    }
  }
  return rumor_buf;
}

Assistant:

char *getrumor(int truth, /* 1=true, -1=false, 0=either */
	       char *rumor_buf,
	       boolean exclude_cookie)
{
	dlb	*rumors;
	int tidbit, beginning;
	char	*endp, line[BUFSZ], xbuf[BUFSZ];

	rumor_buf[0] = '\0';
	if (true_rumor_size < 0L)	/* we couldn't open RUMORFILE */
		return rumor_buf;

	rumors = dlb_fopen(RUMORFILE, "r");

	if (rumors) {
	    int count = 0;
	    int adjtruth;

	    do {
		rumor_buf[0] = '\0';
		if (true_rumor_size == 0L) {	/* if this is 1st outrumor() */
		    init_rumors(rumors);
		    if (true_rumor_size < 0L) {	/* init failed */
			sprintf(rumor_buf, "Error reading \"%.80s\".",
				RUMORFILE);
			return rumor_buf;
		    }
		}
		/*
		 *	input:      1    0   -1
		 *	 rn2 \ +1  2=T  1=T  0=F
		 *	 adj./ +0  1=T  0=F -1=F
		 */
		switch (adjtruth = truth + rn2(2)) {
		  case  2:	/*(might let a bogus input arg sneak thru)*/
		  case  1:  beginning = true_rumor_start;
			    tidbit = mt_random() % true_rumor_size;
			break;
		  case  0:	/* once here, 0 => false rather than "either"*/
		  case -1:  beginning = false_rumor_start;
			    tidbit = mt_random() % false_rumor_size;
			break;
		  default:
			    warning("strange truth value for rumor");
			return strcpy(rumor_buf, "Oops...");
		}
		dlb_fseek(rumors, beginning + tidbit, SEEK_SET);
		dlb_fgets(line, sizeof line, rumors);
		if (!dlb_fgets(line, sizeof line, rumors) ||
		    (adjtruth > 0 && dlb_ftell(rumors) > true_rumor_end)) {
			/* reached end of rumors -- go back to beginning */
			dlb_fseek(rumors, beginning, SEEK_SET);
			dlb_fgets(line, sizeof line, rumors);
		}
		if ((endp = strchr(line, '\n')) != 0) *endp = 0;
		strcat(rumor_buf, xcrypt(line, xbuf));
	    } while (count++ < 50 && exclude_cookie && (strstri(rumor_buf, "fortune") || strstri(rumor_buf, "pity")));
	    dlb_fclose(rumors);
	    if (count >= 50)
		warning("Can't find non-cookie rumor?");
	    else
		exercise(A_WIS, (adjtruth > 0));
	} else {
		pline("Can't open rumors file!");
		true_rumor_size = -1;	/* don't try to open it again */
	}
	return rumor_buf;
}